

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExportObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,int i)

{
  pointer pBVar1;
  pointer pLVar2;
  char *pcVar3;
  int iVar4;
  Type TVar5;
  undefined4 extraout_var;
  string *psVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarNamer vnam;
  ulong uVar7;
  char *pcVar8;
  ExprBase nonlinear;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  int i_local;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4a8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char *local_488;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_480;
  MemoryWriter w2;
  MemoryWriter wrt;
  undefined4 extraout_var_02;
  
  i_local = i;
  iVar4 = (*(((this->flat_cvt_).
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager.
              graph_exporter_app_._M_t.
              super___uniq_ptr_impl<mp::BasicFileAppender,_std::default_delete<mp::BasicFileAppender>_>
              ._M_t.
              super__Tuple_impl<0UL,_mp::BasicFileAppender_*,_std::default_delete<mp::BasicFileAppender>_>
              .super__Head_base<0UL,_mp::BasicFileAppender_*,_false>._M_head_impl)->
            super_BasicLogger)._vptr_BasicLogger[2])();
  if ((char)iVar4 != '\0') {
    wrt.super_BasicWriter<char>.buffer_ = &wrt.buffer_.super_Buffer<char>;
    wrt.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
    wrt.buffer_.super_Buffer<char>.ptr_ = wrt.buffer_.data_;
    wrt.buffer_.super_Buffer<char>.size_ = 0;
    wrt.buffer_.super_Buffer<char>.capacity_ = 500;
    wrt.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
    jw.wrt_ = &wrt;
    jw.kind_ = Unset;
    jw.n_written_ = 0;
    key._M_str = (char *)0x12;
    key._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2,key);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&w2,&i_local);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2);
    iVar4 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    psVar6 = BasicProblem<mp::BasicProblemParams<int>>::obj_name_abi_cxx11_
                       ((BasicProblem<mp::BasicProblemParams<int>> *)CONCAT44(extraout_var,iVar4),
                        i_local);
    key_00._M_str = (char *)0x4;
    key_00._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2,key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&w2,psVar6);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2);
    iVar4 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    local_480.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
         (BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT44(extraout_var_00,iVar4);
    local_480.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
         i_local;
    local_4a8.wrt_._0_4_ =
         BasicProblem<mp::BasicProblemParams<int>_>::
         BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         ::type(&local_480);
    key_01._M_str = (char *)0x5;
    key_01._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2,key_01);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&w2,
               (int *)&local_4a8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&w2);
    w2.super_BasicWriter<char>.buffer_ = &w2.buffer_.super_Buffer<char>;
    w2.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
    w2.buffer_.super_Buffer<char>.ptr_ = w2.buffer_.data_;
    w2.buffer_.super_Buffer<char>.size_ = 0;
    w2.buffer_.super_Buffer<char>.capacity_ = 500;
    w2.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
    TVar5 = BasicProblem<mp::BasicProblemParams<int>_>::
            BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::type(&local_480);
    pcVar8 = "minimize ";
    if (TVar5 == MAX) {
      pcVar8 = "maximize ";
    }
    pcVar3 = "minimize ";
    if (TVar5 == MAX) {
      pcVar3 = "maximize ";
    }
    fmt::Buffer<char>::append<char>(w2.super_BasicWriter<char>.buffer_,pcVar8,pcVar3 + 9);
    iVar4 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    psVar6 = BasicProblem<mp::BasicProblemParams<int>>::obj_name_abi_cxx11_
                       ((BasicProblem<mp::BasicProblemParams<int>> *)CONCAT44(extraout_var_01,iVar4)
                        ,i_local);
    pcVar8 = (psVar6->_M_dataplus)._M_p;
    fmt::Buffer<char>::append<char>
              (w2.super_BasicWriter<char>.buffer_,pcVar8,pcVar8 + psVar6->_M_string_length);
    fmt::Buffer<char>::append<char>(w2.super_BasicWriter<char>.buffer_,": ","");
    uVar7 = (ulong)local_480.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                   .index_;
    pBVar1 = ((local_480.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_)->nonlinear_objs_).
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)((local_480.
                                super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                               .problem_)->nonlinear_objs_).
                              super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
      nonlinear.impl_ = pBVar1[uVar7].super_ExprBase.impl_;
    }
    else {
      nonlinear.impl_ = (Impl *)0x0;
    }
    pLVar2 = ((local_480.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_)->linear_objs_).
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    vnam.p_._0_4_ =
         (*(this->
           super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
           ).
           super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
           .
           super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
           ._vptr_BasicExprVisitor[0x12])(this);
    vnam.p_._4_4_ = extraout_var_02;
    WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              (&w2.super_BasicWriter<char>,pLVar2 + uVar7,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)nonlinear.impl_,vnam);
    local_488 = fmt::BasicWriter<char>::c_str(&w2.super_BasicWriter<char>);
    key_02._M_str = (char *)0x7;
    key_02._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_4a8,key_02);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_4a8,
               &local_488);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              (&local_4a8);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w2);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&jw);
    fmt::BasicWriter<char>::write<>(&wrt.super_BasicWriter<char>,(BasicCStringRef<char>)0x37fbf3);
    BasicFileAppender::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
              ((this->flat_cvt_).
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager.
               graph_exporter_app_._M_t.
               super___uniq_ptr_impl<mp::BasicFileAppender,_std::default_delete<mp::BasicFileAppender>_>
               ._M_t.
               super__Tuple_impl<0UL,_mp::BasicFileAppender_*,_std::default_delete<mp::BasicFileAppender>_>
               .super__Head_base<0UL,_mp::BasicFileAppender_*,_false>._M_head_impl,&wrt);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&wrt);
  }
  return;
}

Assistant:

void ExportObj(int i) {
    if (GetFlatCvt().GetFileAppender().IsOpen()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["NL_OBJECTIVE_index"] = i;
        jw["name"] = GetModel().obj_name(i);
        auto obj = GetModel().obj(i);
        jw["sense"] = (int)obj.type();
        fmt::MemoryWriter w2;
        w2 << (obj::MAX==obj.type() ? "maximize " : "minimize ");
        w2 << GetModel().obj_name(i) << ": ";
        WriteExpr<typename ProblemType::ExprTypes>(
              w2, obj.linear_expr(), obj.nonlinear_expr(),
              GetModel().GetVarNamer());
        jw["printed"] = w2.c_str();
      }
      wrt.write("\n");                     // EOL
      GetFlatCvt().GetFileAppender().Append(wrt);
    }
  }